

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::DisplayOutputs(cmCursesMainForm *this,string *newOutput)

{
  cmCursesLongMessageForm *pcVar1;
  cmCursesLongMessageForm *this_00;
  uint uVar2;
  uint uVar3;
  
  if (_stdscr == 0) {
    uVar3 = 0xffffffff;
    uVar2 = uVar3;
  }
  else {
    uVar3 = (int)*(short *)(_stdscr + 6) + 1;
    uVar2 = (int)*(short *)(_stdscr + 4) + 1;
  }
  pcVar1 = (this->LogForm)._M_t.
           super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
           .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
  if ((cmCursesLongMessageForm *)cmCursesForm::CurrentForm != pcVar1) {
    this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm
              (this_00,&this->Outputs,(this->LastProgress)._M_dataplus._M_p,ScrollDown);
    pcVar1 = (this->LogForm)._M_t.
             super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
             .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (this->LogForm)._M_t.
    super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>.
    _M_t.
    super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
    .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl = this_00;
    if (pcVar1 != (cmCursesLongMessageForm *)0x0) {
      (**(code **)((long)(pcVar1->super_cmCursesForm)._vptr_cmCursesForm + 8))();
      this_00 = (this->LogForm)._M_t.
                super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
                .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
    }
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])(this_00,1,1,(ulong)uVar3,(ulong)uVar2);
    return;
  }
  cmCursesLongMessageForm::UpdateContent(pcVar1,newOutput,&this->LastProgress);
  return;
}

Assistant:

void cmCursesMainForm::DisplayOutputs(std::string const& newOutput)
{
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);

  if (CurrentForm != this->LogForm.get()) {
    auto* newLogForm = new cmCursesLongMessageForm(
      this->Outputs, this->LastProgress.c_str(),
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    CurrentForm = newLogForm;
    this->LogForm.reset(newLogForm);
    this->LogForm->Render(1, 1, xi, yi);
  } else {
    this->LogForm->UpdateContent(newOutput, this->LastProgress);
  }
}